

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::busyWait(int milliseconds)

{
  deUint64 dVar1;
  deUint64 dVar2;
  int local_20;
  float local_1c;
  int i;
  float v;
  deUint64 startTime;
  int milliseconds_local;
  
  dVar1 = deGetMicroseconds();
  local_1c = 2.0;
  do {
    for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
      local_1c = deFloatSin(local_1c);
    }
    dVar2 = deGetMicroseconds();
  } while (dVar2 - dVar1 < (ulong)(long)(milliseconds * 1000));
  return;
}

Assistant:

static void busyWait (int milliseconds)
{
	const deUint64	startTime	= deGetMicroseconds();
	float			v			= 2.0f;

	for (;;)
	{
		for (int i = 0; i < 10; i++)
			v = deFloatSin(v);

		if (deGetMicroseconds()-startTime >= deUint64(1000*milliseconds))
			break;
	}
}